

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

qint64 __thiscall QFileDevice::readData(QFileDevice *this,char *data,qint64 len)

{
  QFileDevicePrivate *this_00;
  QAbstractFileEngine *pQVar1;
  bool bVar2;
  int iVar3;
  FileError FVar4;
  int extraout_var;
  FileError FVar5;
  QFileDevicePrivate *d;
  long lVar6;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (len == 0) {
    lVar6 = 0;
  }
  else {
    this_00 = (QFileDevicePrivate *)
              (this->super_QIODevice).d_ptr._M_t.
              super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
              super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
              super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
    QFileDevicePrivate::setError(this_00,NoError);
    if (this_00->lastWasWrite == true) {
      this_00->lastWasWrite = false;
      bVar2 = flush((QFileDevice *)(this_00->super_QIODevicePrivate).q_ptr);
      lVar6 = -1;
      if (!bVar2) goto LAB_00117fb9;
    }
    pQVar1 = (this_00->fileEngine)._M_t.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
    iVar3 = (*pQVar1->_vptr_QAbstractFileEngine[0x23])(pQVar1,data,len);
    lVar6 = CONCAT44(extraout_var,iVar3);
    if (extraout_var < 0) {
      FVar4 = QAbstractFileEngine::error
                        ((this_00->fileEngine)._M_t.
                         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                         .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
      FVar5 = ReadError;
      if (FVar4 != UnspecifiedError) {
        FVar5 = FVar4;
      }
      QAbstractFileEngine::errorString
                (&local_48,
                 (this_00->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
      ((FileHandleFlags *)&this_00->error)->
      super_QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4> =
           (QFlagsStorageHelper<QFileDevice::FileHandleFlag,_4>)FVar5;
      QString::operator=(&(this_00->super_QIODevicePrivate).errorString,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (lVar6 < len) {
      this_00->cachedSize = 0;
    }
  }
LAB_00117fb9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar6;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QFileDevice::readData(char *data, qint64 len)
{
    Q_D(QFileDevice);
    if (!len)
        return 0;
    unsetError();
    if (!d->ensureFlushed())
        return -1;

    const qint64 read = d->fileEngine->read(data, len);
    if (read < 0) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::ReadError;
        d->setError(err, d->fileEngine->errorString());
    }

    if (read < len) {
        // failed to read all requested, may be at the end of file, stop caching size so that it's rechecked
        d->cachedSize = 0;
    }

    return read;
}